

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O2

char * ngx_http_upsync_set_lb(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  undefined8 uStack_20;
  
  lVar1 = *(long *)(*(long *)((long)cf->ctx + 8) + ngx_http_upsync_module.ctx_index * 8);
  pvVar2 = cf->args->elts;
  lVar3 = *(long *)((long)pvVar2 + 0x10);
  if (lVar3 == -1) {
    uStack_20 = 0;
  }
  else if (lVar3 == 0xb) {
    pvVar2 = *(void **)((long)pvVar2 + 0x18);
    iVar4 = bcmp(pvVar2,"hash_modula",0xb);
    if (iVar4 == 0) {
      uStack_20 = 8;
    }
    else {
      iVar4 = bcmp(pvVar2,"hash_ketama",0xb);
      if (iVar4 != 0) {
        return (char *)0x0;
      }
      uStack_20 = 0x10;
    }
  }
  else if (lVar3 == 10) {
    pvVar2 = *(void **)((long)pvVar2 + 0x18);
    iVar4 = bcmp(pvVar2,"roundrobin",10);
    if (iVar4 == 0) {
      uStack_20 = 1;
    }
    else {
      iVar4 = bcmp(pvVar2,"least_conn",10);
      if (iVar4 != 0) {
        return (char *)0x0;
      }
      uStack_20 = 4;
    }
  }
  else {
    if (lVar3 != 7) {
      return (char *)0x0;
    }
    iVar4 = bcmp(*(void **)((long)pvVar2 + 0x18),"ip_hash",7);
    if (iVar4 != 0) {
      return (char *)0x0;
    }
    uStack_20 = 2;
  }
  *(undefined8 *)(lVar1 + 0x28) = uStack_20;
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_upsync_set_lb(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_str_t                         *value, *str;
    ngx_http_upsync_srv_conf_t        *upscf;

    upscf = ngx_http_conf_get_module_srv_conf(cf,
                                              ngx_http_upsync_module);
    value = cf->args->elts;

    str = &value[1];
    if (str->len == NGX_CONF_UNSET_SIZE) {
        upscf->upsync_lb = NGX_HTTP_LB_DEFAULT;

        return NGX_CONF_OK; 
    }

    switch(str->len) {
        case 7:
            if (ngx_memcmp((char *)str->data, "ip_hash", 7) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_IP_HASH;

                return NGX_CONF_OK;
            }

            break;

        case 10:
            if (ngx_memcmp((char *)str->data, "roundrobin", 10) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_ROUNDROBIN;

                return NGX_CONF_OK;
            }

            if (ngx_memcmp((char *)str->data, "least_conn", 10) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_LEAST_CONN;

                return NGX_CONF_OK;
            }

            break;

        case 11:
            if (ngx_memcmp((char *)str->data, "hash_modula", 11) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_HASH_MODULA;

                return NGX_CONF_OK;
            }

            if (ngx_memcmp((char *)str->data, "hash_ketama", 11) == 0) {
                upscf->upsync_lb = NGX_HTTP_LB_HASH_KETAMA;

                return NGX_CONF_OK;
            }

            break;
    }

    return NGX_CONF_OK;
}